

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::NotImplementedException::~NotImplementedException(NotImplementedException *this)

{
  *(undefined ***)this = &PTR__NotImplementedException_001613d8;
  std::__cxx11::string::~string((string *)&this->m_lineInfo);
  std::__cxx11::string::~string((string *)&this->m_what);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~NotImplementedException() throw() {}